

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeFirstAlgorithm.cpp
# Opt level: O2

void __thiscall
van_kampen::LargeFirstAlgorithm::generate
          (LargeFirstAlgorithm *this,
          vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
          *words)

{
  int iVar1;
  ulong uVar2;
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  *pvVar3;
  bool bVar4;
  ulong uVar5;
  size_t sVar6;
  iterator it;
  iterator it_00;
  ostream *poVar7;
  int iVar8;
  ulong total;
  reference rVar9;
  bool force;
  bool oneAdded;
  size_t local_130;
  LargeFirstAlgorithm *local_128;
  vector<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
  *local_120;
  anon_class_16_2_12726816 prevNotAdded;
  anon_class_16_2_0b5c3d9c added;
  vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_> local_f8;
  anon_class_48_6_f85bbd33 add;
  vector<bool,_std::allocator<bool>_> isAdded;
  ProcessLogger logger;
  anon_class_16_2_12726816 nextNotAdded;
  
  uVar5 = ((long)(words->
                 super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(words->
                super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  uVar2 = this->cellsLimit;
  total = uVar5;
  if (uVar2 < uVar5) {
    total = uVar2;
  }
  if (uVar2 == 0) {
    total = uVar5;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&add,"Relations used",(allocator<char> *)&isAdded);
  ProcessLogger::ProcessLogger(&logger,total,(ostream *)&std::clog,(string *)&add,this->quiet);
  std::__cxx11::string::~string((string *)&add);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&isAdded,((long)(words->
                             super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(words->
                            super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0x18,
             (allocator_type *)&add);
  added.isAdded = &isAdded;
  added.words = words;
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::vector
            (&local_f8,
             (words->
             super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish + -1);
  Diagramm::bindWord(&this->diagramm_,&local_f8,false,true);
  std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>::~vector
            (&local_f8);
  rVar9 = std::vector<bool,_std::allocator<bool>_>::back(&isAdded);
  *rVar9._M_p = *rVar9._M_p | rVar9._M_mask;
  ProcessLogger::iterate(&logger);
  add.oneAdded = &oneAdded;
  oneAdded = false;
  add.force = &force;
  force = false;
  add.added = &added;
  it._M_current =
       (words->
       super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  it_00._M_current =
       (words->
       super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish + -2;
  local_130 = total;
  local_128 = this;
  local_120 = words;
  prevNotAdded.words = words;
  prevNotAdded.isAdded = &isAdded;
  add.this = this;
  add.isAdded = &isAdded;
  add.words = words;
  nextNotAdded.words = words;
  nextNotAdded.isAdded = &isAdded;
  do {
    do {
      iVar1 = local_128->maximalSmallForOneBig;
      iVar8 = iVar1;
      while( true ) {
        bVar4 = generate::anon_class_48_6_f85bbd33::operator()(&add,it_00);
        if (bVar4) break;
        bVar4 = iVar8 == 0;
        iVar8 = iVar8 + -1;
        if (bVar4 && iVar1 != 0) goto LAB_0015d5c1;
        bVar4 = generate::anon_class_48_6_f85bbd33::operator()(&add,it);
        if (bVar4) {
          sVar6 = ProcessLogger::iterate(&logger);
          if (local_130 <= sVar6) goto LAB_0015d668;
        }
        it = generate::anon_class_16_2_12726816::operator()(&nextNotAdded,it._M_current + 1);
      }
      sVar6 = ProcessLogger::iterate(&logger);
      if (local_130 <= sVar6) goto LAB_0015d668;
LAB_0015d5c1:
      it_00 = generate::anon_class_16_2_12726816::operator()(&prevNotAdded,it_00);
      pvVar3 = local_120;
    } while (it._M_current < it_00._M_current);
    it = generate::anon_class_16_2_12726816::operator()
                   (&nextNotAdded,
                    (local_120->
                    super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
    it_00 = generate::anon_class_16_2_12726816::operator()
                      (&prevNotAdded,
                       (pvVar3->
                       super__Vector_base<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>,_std::allocator<std::vector<van_kampen::GroupElement,_std::allocator<van_kampen::GroupElement>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    if (oneAdded == false) {
      if ((force == true) && (local_128->quiet == false)) {
        poVar7 = std::operator<<((ostream *)&std::clog,"can not bind ");
        ProcessLogger::getIteration(&logger);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::operator<<(poVar7," relations, finishing");
LAB_0015d668:
        std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                  (&isAdded.super__Bvector_base<std::allocator<bool>_>);
        ProcessLogger::~ProcessLogger(&logger);
        return;
      }
      force = true;
    }
    oneAdded = false;
  } while( true );
}

Assistant:

void LargeFirstAlgorithm::generate(const std::vector<std::vector<GroupElement>> &words)
{
    std::size_t totalIterations = words.size();
    if (cellsLimit)
    {
        totalIterations = std::min(totalIterations, cellsLimit);
    }
    ProcessLogger logger(totalIterations, std::clog, "Relations used", quiet);

    std::vector<bool> isAdded(words.size());
    using iterator = std::vector<std::vector<GroupElement>>::const_iterator;
    auto added = [&](iterator it) {
        return isAdded[it - begin(words)];
    };
    diagramm_.bindWord(words.back(), false, true);
    isAdded.back() = true;
    logger.iterate();
    bool oneAdded = false;
    bool force = false;
    auto add = [&](iterator it) {
        if (added(it))
        {
            throw std::logic_error("trying to add already added word");
        }
        if (diagramm_.bindWord(*it, force, false))
        {
            isAdded[it - begin(words)] = true;
            oneAdded = true;
            return true;
        }
        return false;
    };
    auto smallIt = words.begin();
    auto bigIt = prev(prev(words.end()));
    auto nextNotAdded = [&](iterator it) {
        while (it < end(words) && isAdded[it - begin(words)])
            ++it;
        return it;
    };
    auto prevNotAdded = [&](iterator it) {
        while (--it >= begin(words) && isAdded[it - begin(words)])
            ;
        return it;
    };
    while (true)
    {
        int rest = maximalSmallForOneBig;
        bool infinite = rest == 0;
        bool success = true;
        while (!add(bigIt))
        {
            if (rest-- == 0 && !infinite)
            {
                success = false;
                break;
            }

            if (add(smallIt) && logger.iterate() >= totalIterations)
                return;

            smallIt = nextNotAdded(smallIt + 1);
        }

        if (success && logger.iterate() >= totalIterations)
            return;

        bigIt = prevNotAdded(bigIt);
        if (smallIt >= bigIt)
        {
            smallIt = nextNotAdded(begin(words));
            bigIt = prevNotAdded(words.end());

            if (!oneAdded)
            {
                if (force && !quiet)
                {
                    if (!quiet)
                        std::clog << "can not bind " << totalIterations - logger.getIteration() << " relations, finishing";
                    return;
                }
                force = true;
            }
            oneAdded = false;
        }
    }
}